

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall
btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  Joint **ptr;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Joint *pJVar8;
  btTransform *pbVar9;
  Joint **ppJVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float local_64;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_48;
  float local_40;
  
  pJVar8 = (Joint *)btAlignedAllocInternal(0xd8,0x10);
  memset(pJVar8->m_refs,0,0xa0);
  pJVar8->_vptr_Joint = (_func_int **)&PTR__Joint_00221460;
  pJVar8->m_bodies[0].m_soft = body0;
  pJVar8->m_bodies[0].m_rigid = (btRigidBody *)0x0;
  pJVar8->m_bodies[0].m_collisionObject = (btCollisionObject *)0x0;
  pJVar8->m_bodies[1].m_soft = body1.m_soft;
  pJVar8->m_bodies[1].m_rigid = body1.m_rigid;
  pJVar8->m_bodies[1].m_collisionObject = body1.m_collisionObject;
  pbVar9 = Body::xform(pJVar8->m_bodies);
  btTransform::inverse(pbVar9);
  fVar1 = (specs->position).m_floats[0];
  fVar2 = (specs->position).m_floats[1];
  fVar3 = (specs->position).m_floats[2];
  fVar13 = (float)((ulong)local_48 >> 0x20);
  auVar5._4_4_ = fVar13 + local_60 * fVar3 + local_68 * fVar1 + local_64 * fVar2;
  auVar5._0_4_ = (float)local_48 + fStack_70 * fVar3 + local_78 * fVar1 + fStack_74 * fVar2;
  auVar5._8_4_ = local_50 * fVar3 + local_58 * fVar1 + local_54 * fVar2 + local_40;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])pJVar8->m_refs[0].m_floats = auVar5;
  pbVar9 = Body::xform(pJVar8->m_bodies + 1);
  btTransform::inverse(pbVar9);
  fVar1 = (specs->position).m_floats[0];
  fVar2 = (specs->position).m_floats[1];
  fVar3 = (specs->position).m_floats[2];
  auVar6._4_4_ = fVar13 + local_60 * fVar3 + local_68 * fVar1 + local_64 * fVar2;
  auVar6._0_4_ = (float)local_48 + fStack_70 * fVar3 + local_78 * fVar1 + fStack_74 * fVar2;
  auVar6._8_4_ = local_50 * fVar3 + local_58 * fVar1 + local_54 * fVar2 + local_40;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])pJVar8->m_refs[1].m_floats = auVar6;
  uVar4 = *(undefined8 *)specs;
  pJVar8->m_cfm = (btScalar)(int)((ulong)uVar4 >> 0x20);
  pJVar8->m_erp = (btScalar)(int)uVar4;
  pJVar8->m_split = *(btScalar *)&specs->field_0x8;
  uVar7 = (this->m_joints).m_size;
  if (uVar7 == (this->m_joints).m_capacity) {
    iVar12 = 1;
    if (uVar7 != 0) {
      iVar12 = uVar7 * 2;
    }
    if ((int)uVar7 < iVar12) {
      if (iVar12 == 0) {
        ppJVar10 = (Joint **)0x0;
      }
      else {
        ppJVar10 = (Joint **)btAlignedAllocInternal((long)iVar12 << 3,0x10);
        uVar7 = (this->m_joints).m_size;
      }
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          ppJVar10[uVar11] = (this->m_joints).m_data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      ptr = (this->m_joints).m_data;
      if ((ptr != (Joint **)0x0) && ((this->m_joints).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar7 = (this->m_joints).m_size;
      }
      (this->m_joints).m_ownsMemory = true;
      (this->m_joints).m_data = ppJVar10;
      (this->m_joints).m_capacity = iVar12;
    }
  }
  (this->m_joints).m_data[(int)uVar7] = pJVar8;
  (this->m_joints).m_size = uVar7 + 1;
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,Cluster* body0,Body body1)
{
	LJoint*		pj	=	new(btAlignedAlloc(sizeof(LJoint),16)) LJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse()*specs.position;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse()*specs.position;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	m_joints.push_back(pj);
}